

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utp_stream.hpp
# Opt level: O0

void __thiscall
libtorrent::aux::utp_stream::
async_read_some<boost::asio::mutable_buffer,boost::asio::ssl::detail::io_op<libtorrent::aux::utp_stream,boost::asio::ssl::detail::shutdown_op,libtorrent::aux::socket_closer>>
          (utp_stream *this,mutable_buffer *buffers,
          io_op<libtorrent::aux::utp_stream,_boost::asio::ssl::detail::shutdown_op,_libtorrent::aux::socket_closer>
          *handler)

{
  io_context *piVar1;
  bool bVar2;
  size_t sVar3;
  void *buf;
  unsigned_long local_1d8;
  error_code local_1d0;
  type local_1c0;
  mutable_buffer *local_148;
  mutable_buffer *end;
  mutable_buffer *i;
  size_t bytes_added;
  basic_errors local_124;
  type local_120;
  unsigned_long local_a0;
  basic_errors local_94;
  type local_90;
  io_op<libtorrent::aux::utp_stream,_boost::asio::ssl::detail::shutdown_op,_libtorrent::aux::socket_closer>
  *local_20;
  io_op<libtorrent::aux::utp_stream,_boost::asio::ssl::detail::shutdown_op,_libtorrent::aux::socket_closer>
  *handler_local;
  mutable_buffer *buffers_local;
  utp_stream *this_local;
  
  local_20 = handler;
  handler_local =
       (io_op<libtorrent::aux::utp_stream,_boost::asio::ssl::detail::shutdown_op,_libtorrent::aux::socket_closer>
        *)buffers;
  buffers_local = (mutable_buffer *)this;
  if (this->m_impl == (utp_socket_impl *)0x0) {
    piVar1 = this->m_io_service;
    local_94 = not_connected;
    local_a0 = 0;
    ::std::
    bind<void,boost::asio::ssl::detail::io_op<libtorrent::aux::utp_stream,boost::asio::ssl::detail::shutdown_op,libtorrent::aux::socket_closer>,boost::asio::error::basic_errors,unsigned_long>
              (&local_90,handler,&local_94,&local_a0);
    boost::asio::
    post<boost::asio::io_context,std::_Bind_result<void,boost::asio::ssl::detail::io_op<libtorrent::aux::utp_stream,boost::asio::ssl::detail::shutdown_op,libtorrent::aux::socket_closer>(boost::asio::error::basic_errors,unsigned_long)>>
              (piVar1,&local_90,(type *)0x0);
    ::std::
    _Bind_result<void,_boost::asio::ssl::detail::io_op<libtorrent::aux::utp_stream,_boost::asio::ssl::detail::shutdown_op,_libtorrent::aux::socket_closer>_(boost::asio::error::basic_errors,_unsigned_long)>
    ::~_Bind_result(&local_90);
  }
  else {
    bVar2 = ::std::function::operator_cast_to_bool((function *)&this->m_read_handler);
    if (bVar2) {
      piVar1 = this->m_io_service;
      local_124 = operation_not_supported;
      bytes_added = 0;
      ::std::
      bind<void,boost::asio::ssl::detail::io_op<libtorrent::aux::utp_stream,boost::asio::ssl::detail::shutdown_op,libtorrent::aux::socket_closer>,boost::asio::error::basic_errors,unsigned_long>
                (&local_120,handler,&local_124,&bytes_added);
      boost::asio::
      post<boost::asio::io_context,std::_Bind_result<void,boost::asio::ssl::detail::io_op<libtorrent::aux::utp_stream,boost::asio::ssl::detail::shutdown_op,libtorrent::aux::socket_closer>(boost::asio::error::basic_errors,unsigned_long)>>
                (piVar1,&local_120,(type *)0x0);
      ::std::
      _Bind_result<void,_boost::asio::ssl::detail::io_op<libtorrent::aux::utp_stream,_boost::asio::ssl::detail::shutdown_op,_libtorrent::aux::socket_closer>_(boost::asio::error::basic_errors,_unsigned_long)>
      ::~_Bind_result(&local_120);
    }
    else {
      i = (mutable_buffer *)0x0;
      end = boost::asio::buffer_sequence_begin<boost::asio::mutable_buffer>
                      ((mutable_buffer *)handler_local,(type *)0x0);
      local_148 = boost::asio::buffer_sequence_end<boost::asio::mutable_buffer>
                            ((mutable_buffer *)handler_local,(type *)0x0);
      for (; end != local_148; end = end + 1) {
        sVar3 = boost::asio::mutable_buffer::size(end);
        if (sVar3 != 0) {
          buf = boost::asio::mutable_buffer::data(end);
          sVar3 = boost::asio::mutable_buffer::size(end);
          add_read_buffer(this,buf,(int)sVar3);
          sVar3 = boost::asio::mutable_buffer::size(end);
          i = (mutable_buffer *)((long)&i->data_ + sVar3);
        }
      }
      if (i == (mutable_buffer *)0x0) {
        piVar1 = this->m_io_service;
        boost::system::error_code::error_code(&local_1d0);
        local_1d8 = 0;
        ::std::
        bind<void,boost::asio::ssl::detail::io_op<libtorrent::aux::utp_stream,boost::asio::ssl::detail::shutdown_op,libtorrent::aux::socket_closer>,boost::system::error_code,unsigned_long>
                  (&local_1c0,handler,&local_1d0,&local_1d8);
        boost::asio::
        post<boost::asio::io_context,std::_Bind_result<void,boost::asio::ssl::detail::io_op<libtorrent::aux::utp_stream,boost::asio::ssl::detail::shutdown_op,libtorrent::aux::socket_closer>(boost::system::error_code,unsigned_long)>>
                  (piVar1,&local_1c0,(type *)0x0);
        ::std::
        _Bind_result<void,_boost::asio::ssl::detail::io_op<libtorrent::aux::utp_stream,_boost::asio::ssl::detail::shutdown_op,_libtorrent::aux::socket_closer>_(boost::system::error_code,_unsigned_long)>
        ::~_Bind_result(&local_1c0);
      }
      else {
        ::std::function<void(boost::system::error_code_const&,unsigned_long)>::operator=
                  ((function<void(boost::system::error_code_const&,unsigned_long)> *)
                   &this->m_read_handler,handler);
        issue_read(this);
      }
    }
  }
  return;
}

Assistant:

void async_read_some(Mutable_Buffers const& buffers, Handler handler)
	{
		if (m_impl == nullptr)
		{
			post(m_io_service, std::bind<void>(std::move(handler), boost::asio::error::not_connected, std::size_t(0)));
			return;
		}

		TORRENT_ASSERT(!m_read_handler);
		if (m_read_handler)
		{
			post(m_io_service, std::bind<void>(std::move(handler), boost::asio::error::operation_not_supported, std::size_t(0)));
			return;
		}
		std::size_t bytes_added = 0;
		for (auto i = buffer_sequence_begin(buffers)
			, end(buffer_sequence_end(buffers)); i != end; ++i)
		{
			if (i->size() == 0) continue;
			add_read_buffer(i->data(), int(i->size()));
			bytes_added += i->size();
		}
		if (bytes_added == 0)
		{
			// if we're reading 0 bytes, post handler immediately
			// asio's SSL layer depends on this behavior
			post(m_io_service, std::bind<void>(std::move(handler), error_code(), std::size_t(0)));
			return;
		}

		m_read_handler = std::move(handler);
		issue_read();
	}